

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# menu.cpp
# Opt level: O3

void M_StartControlPanel(bool makeSound)

{
  long lVar1;
  FSoundID local_1c;
  
  if (DMenu::CurrentMenu != (DMenu *)0x0) {
    return;
  }
  ResetButtonStates();
  lVar1 = 0;
  do {
    FButtonStatus::ReleaseKey((FButtonStatus *)((long)MenuButtons[0].Keys + lVar1),0);
    lVar1 = lVar1 + 0x10;
  } while (lVar1 != 0x90);
  C_HideConsole();
  menuactive = MENU_On;
  P_CheckTickerPaused();
  if (makeSound) {
    local_1c.ID = S_FindSound("menu/activate");
    S_Sound(0x22,&local_1c,snd_menuvolume.Value,0.0);
  }
  BackbuttonTime = 0;
  BackbuttonAlpha = 0.0;
  return;
}

Assistant:

void M_StartControlPanel (bool makeSound)
{
	// intro might call this repeatedly
	if (DMenu::CurrentMenu != NULL)
		return;

	ResetButtonStates ();
	for (int i = 0; i < NUM_MKEYS; ++i)
	{
		MenuButtons[i].ReleaseKey(0);
	}

	C_HideConsole ();				// [RH] Make sure console goes bye bye.
	menuactive = MENU_On;
	// Pause sound effects before we play the menu switch sound.
	// That way, it won't be paused.
	P_CheckTickerPaused ();

	if (makeSound)
	{
		S_Sound (CHAN_VOICE | CHAN_UI, "menu/activate", snd_menuvolume, ATTN_NONE);
	}
	BackbuttonTime = 0;
	BackbuttonAlpha = 0;
}